

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoHandler.cpp
# Opt level: O0

int __thiscall VideoHandler::preProcess(VideoHandler *this,string *videoInFile,string *targetName)

{
  bool bVar1;
  element_type *peVar2;
  ulong uVar3;
  ostream *this_00;
  string *in_RDX;
  char **in_RSI;
  shared_ptr<cv::VideoCapture> *in_RDI;
  shared_ptr<cv::VideoCapture> *in_stack_ffffffffffffffb8;
  
  std::__cxx11::string::c_str();
  std::make_shared<cv::VideoCapture,char_const*>(in_RSI);
  std::shared_ptr<cv::VideoCapture>::operator=(in_RDI,in_stack_ffffffffffffffb8);
  std::shared_ptr<cv::VideoCapture>::~shared_ptr((shared_ptr<cv::VideoCapture> *)0x14e8a8);
  bVar1 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr *)
                     &in_RDI[3].super___shared_ptr<cv::VideoCapture,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<cv::VideoCapture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cv::VideoCapture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x14e8ca);
    uVar3 = (**(code **)(*(long *)peVar2 + 0x30))();
    if ((uVar3 & 1) != 0) {
      std::__cxx11::string::operator=((string *)(in_RDI + 7),in_RDX);
      return 0;
    }
  }
  this_00 = std::operator<<((ostream *)&std::cout,"Error open video file");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return -1;
}

Assistant:

int VideoHandler::preProcess(const std::string &videoInFile, const std::string &targetName) 
{
    m_cap = std::make_shared<cv::VideoCapture>(videoInFile.c_str());
    if (!m_cap || !m_cap->isOpened()) 
    {
        std::cout << "Error open video file" << std::endl;
        return -1;
    }
 
    m_targetName = targetName;
    return 0;
}